

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhash.cpp
# Opt level: O0

void __thiscall CVmHashTable::add(CVmHashTable *this,CVmHashEntry *entry)

{
  uint uVar1;
  CVmHashTable *in_RSI;
  long *in_RDI;
  uint hash;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  uVar1 = compute_hash(in_RSI,(CVmHashEntry *)
                              CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  in_RSI->table_size_ = *(size_t *)(*in_RDI + (ulong)uVar1 * 8);
  *(CVmHashTable **)(*in_RDI + (ulong)uVar1 * 8) = in_RSI;
  return;
}

Assistant:

void CVmHashTable::add(CVmHashEntry *entry)
{
    unsigned int hash;

    /* compute the hash value for this entry */
    hash = compute_hash(entry);

    /* link it into the slot for this hash value */
    entry->nxt_ = table_[hash];
    table_[hash] = entry;
}